

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<float>_>::SolveSOR
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  _ComplexT _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float __x;
  float fVar13;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar14;
  undefined4 extraout_XMM0_Da_01;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined8 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 local_b8;
  undefined4 local_58;
  long lVar6;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  fVar17 = (float)*tol;
  fVar12 = fVar17 * 2.0;
  if ((NAN(fVar12)) && (NAN(fVar17 * 0.0))) {
    fVar12 = (float)__mulsc3(0x40000000,0,fVar17,0);
  }
  if (residual == (TPZFMatrix<std::complex<float>_> *)0x0) {
    fVar12 = fVar12 + 1.0;
  }
  else {
    Dot<std::complex<float>>(residual,residual);
    if (__x < 0.0) {
      fVar12 = sqrtf(__x);
    }
    else {
      fVar12 = SQRT(__x);
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar6 = CONCAT44(extraout_var,iVar5);
  lVar10 = 0;
  lVar7 = lVar6 + -1;
  lVar3 = -1;
  if (direction != -1) {
    lVar7 = lVar10;
    lVar3 = lVar6;
  }
  if (0 < *numiterations) {
    lVar2 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    fVar17 = (float)overrelax;
    lVar10 = 0;
    do {
      fVar13 = cabsf(fVar12);
      if ((double)ABS(fVar13) <= ABS(*tol)) break;
      if (lVar2 < 1) {
        fVar12 = 0.0;
      }
      else {
        fVar12 = 0.0;
        lVar8 = 0;
        lVar9 = 0;
        lVar4 = lVar7;
        do {
          for (; lVar4 != lVar3; lVar4 = lVar4 + (ulong)(direction != -1) * 2 + -1) {
            (*(F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(F,lVar4,lVar9);
            fVar13 = extraout_XMM0_Da;
            fVar20 = extraout_XMM0_Db;
            if (0 < lVar6) {
              lVar11 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar4,lVar11);
                if (((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                     lVar11) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar9)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                _Var1 = *(_ComplexT *)
                         ((long)&result->fElem[lVar11]._M_value +
                         (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         lVar8);
                fVar18 = (float)_Var1;
                fVar19 = (float)(_Var1 >> 0x20);
                fVar14 = extraout_XMM0_Da_00 * fVar18 - extraout_XMM0_Db_00 * fVar19;
                fVar16 = extraout_XMM0_Da_00 * fVar19 + extraout_XMM0_Db_00 * fVar18;
                uVar15 = CONCAT44(fVar16,fVar14);
                if ((NAN(fVar14)) && (uVar15 = CONCAT44(fVar16,fVar14), NAN(fVar16))) {
                  uVar15 = __mulsc3(extraout_XMM0_Da_00,extraout_XMM0_Db_00,fVar18,fVar19);
                }
                fVar13 = fVar13 - (float)uVar15;
                fVar20 = fVar20 - (float)((ulong)uVar15 >> 0x20);
                lVar11 = lVar11 + 1;
              } while (lVar6 != lVar11);
            }
            fVar14 = fVar13 * fVar13 - fVar20 * fVar20;
            if ((NAN(fVar14)) && (NAN(fVar13 * fVar20 + fVar20 * fVar13))) {
              fVar14 = (float)__mulsc3(fVar13,fVar20);
            }
            fVar16 = fVar13 * fVar17 - fVar20 * 0.0;
            fVar20 = fVar13 * 0.0 + fVar20 * fVar17;
            uVar15 = CONCAT44(fVar20,fVar16);
            if ((NAN(fVar16)) && (uVar15 = CONCAT44(fVar20,fVar16), NAN(fVar20))) {
              uVar15 = __mulsc3(fVar17,0,fVar13);
            }
            local_58 = (undefined4)((ulong)uVar15 >> 0x20);
            local_b8 = (undefined4)uVar15;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4)
            ;
            uVar15 = __divsc3(local_b8,local_58,extraout_XMM0_Da_01,extraout_XMM0_Db_01);
            if (((lVar4 < 0) ||
                ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar4))
               || ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar9
                  )) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            fVar12 = fVar12 + fVar14;
            lVar11 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                     lVar9;
            _Var1 = result->fElem[lVar11 + lVar4]._M_value;
            result->fElem[lVar11 + lVar4]._M_value =
                 CONCAT44((float)((ulong)uVar15 >> 0x20) + (float)(_Var1 >> 0x20),
                          (float)uVar15 + (float)_Var1);
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 8;
          lVar4 = lVar7;
        } while (lVar9 != lVar2);
      }
      fVar12 = csqrtf(fVar12);
      lVar10 = lVar10 + 1;
    } while (lVar10 < *numiterations);
  }
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar10;
  fVar12 = cabsf(fVar12);
  *tol = (double)ABS(fVar12);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}